

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_filtered_row(png_structrp png_ptr,png_bytep filtered_row,size_t full_row_length)

{
  png_bytep ppVar1;
  png_bytep tptr;
  size_t full_row_length_local;
  png_bytep filtered_row_local;
  png_structrp png_ptr_local;
  
  png_compress_IDAT(png_ptr,filtered_row,full_row_length,0);
  if (png_ptr->prev_row != (png_bytep)0x0) {
    ppVar1 = png_ptr->prev_row;
    png_ptr->prev_row = png_ptr->row_buf;
    png_ptr->row_buf = ppVar1;
  }
  png_write_finish_row(png_ptr);
  png_ptr->flush_rows = png_ptr->flush_rows + 1;
  if ((png_ptr->flush_dist != 0) && (png_ptr->flush_dist <= png_ptr->flush_rows)) {
    png_write_flush(png_ptr);
  }
  return;
}

Assistant:

static void
png_write_filtered_row(png_structrp png_ptr, png_bytep filtered_row,
    size_t full_row_length/*includes filter byte*/)
{
   png_debug(1, "in png_write_filtered_row");

   png_debug1(2, "filter = %d", filtered_row[0]);

   png_compress_IDAT(png_ptr, filtered_row, full_row_length, Z_NO_FLUSH);

#ifdef PNG_WRITE_FILTER_SUPPORTED
   /* Swap the current and previous rows */
   if (png_ptr->prev_row != NULL)
   {
      png_bytep tptr;

      tptr = png_ptr->prev_row;
      png_ptr->prev_row = png_ptr->row_buf;
      png_ptr->row_buf = tptr;
   }
#endif /* WRITE_FILTER */

   /* Finish row - updates counters and flushes zlib if last row */
   png_write_finish_row(png_ptr);

#ifdef PNG_WRITE_FLUSH_SUPPORTED
   png_ptr->flush_rows++;

   if (png_ptr->flush_dist > 0 &&
       png_ptr->flush_rows >= png_ptr->flush_dist)
   {
      png_write_flush(png_ptr);
   }
#endif /* WRITE_FLUSH */
}